

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_download.c
# Opt level: O0

ufile_error
download(char *bucket_name,char *key,size_t start_position,FILE *f,char *buf,size_t buf_len,
        size_t *return_size)

{
  uint uVar1;
  CURL *curl_00;
  ufile_error uVar2;
  char local_e8 [8];
  char range [64];
  curl_slist *header;
  http_body body;
  size_t local_70;
  size_t end_pos;
  size_t start_pos;
  CURL *curl;
  size_t buf_len_local;
  char *buf_local;
  FILE *f_local;
  size_t start_position_local;
  char *key_local;
  char *bucket_name_local;
  ufile_error error;
  
  uVar2 = check_bucket_key(bucket_name,key);
  error._0_8_ = uVar2.message;
  uVar1 = uVar2.code;
  bucket_name_local = (char *)(ulong)uVar1;
  if ((uVar1 == 0) || ((int)uVar1 / 100 == 2)) {
    curl_00 = (CURL *)curl_easy_init();
    if (curl_00 == (CURL *)0x0) {
      bucket_name_local = (char *)0xffffffec;
      error._0_8_ = anon_var_dwarf_5e6;
    }
    else {
      local_70 = 0;
      if (buf_len != 0) {
        local_70 = (start_position + buf_len) - 1;
      }
      uVar2 = set_download_options(curl_00,bucket_name,key,start_position,local_70);
      error._0_8_ = uVar2.message;
      body.pos_n._0_4_ = uVar2.code;
      bucket_name_local = (char *)(ulong)(uint)body.pos_n;
      if (((uint)body.pos_n == 0) || ((int)(uint)body.pos_n / 100 == 2)) {
        memset(&header,0,0x20);
        if (buf != (char *)0x0) {
          body.buffer_size = 0;
          body.buffer = (char *)buf_len;
        }
        header = (curl_slist *)f;
        body.f = (FILE *)buf;
        curl_easy_setopt(curl_00,0x4e2b,http_write_cb);
        curl_easy_setopt(curl_00,0x2711,&header);
        range[0x38] = '\0';
        range[0x39] = '\0';
        range[0x3a] = '\0';
        range[0x3b] = '\0';
        range[0x3c] = '\0';
        range[0x3d] = '\0';
        range[0x3e] = '\0';
        range[0x3f] = '\0';
        if (local_70 != start_position) {
          memset(local_e8,0,0x40);
          sprintf(local_e8,"Range: bytes=%ld-%ld",start_position,local_70);
          range._56_8_ = curl_slist_append(range._56_8_,local_e8);
          curl_easy_setopt(curl_00,0x2727,range._56_8_);
        }
        uVar2 = curl_do(curl_00);
        error._0_8_ = uVar2.message;
        bucket_name_local = (char *)(ulong)(uint)uVar2.code;
        if (return_size != (size_t *)0x0) {
          *return_size = body.buffer_size;
        }
        if (local_70 != start_position) {
          curl_slist_free_all(range._56_8_);
        }
        curl_easy_cleanup(curl_00);
      }
      else {
        curl_easy_cleanup(curl_00);
      }
    }
  }
  uVar2.message = (char *)error._0_8_;
  uVar2._0_8_ = bucket_name_local;
  return uVar2;
}

Assistant:

static struct ufile_error
download(const char *bucket_name,
         const char *key,
         size_t start_position,
         FILE *f,
         char *buf,
         size_t buf_len,
         size_t *return_size)
{
    struct ufile_error error = NO_ERROR;
    error = check_bucket_key(bucket_name, key);
    if(UFILE_HAS_ERROR(error.code)){
        return error;
    }
    CURL *curl = curl_easy_init();
    if(curl == NULL){
        error.code = CURL_ERROR_CODE;
        error.message = CURL_INIT_ERROR_MSG;
        return error;
    }
    size_t start_pos=start_position;
    size_t end_pos=0;
    if(buf_len > 0){
        end_pos = start_position+buf_len-1;
    }

    error = set_download_options(curl, bucket_name, key, start_position, end_pos);
    if(UFILE_HAS_ERROR(error.code)){
        curl_easy_cleanup(curl);
        return error;
    }

    struct http_body body;
    memset(&body, 0, sizeof(struct http_body));
    body.buffer = buf;
    if(body.buffer != NULL){
        body.buffer_size = buf_len;
        body.pos_n = 0;
    }
    body.f = f;
    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, http_write_cb);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, &body);

    struct curl_slist *header=NULL; 
    if((end_pos - start_pos) > 0){
        char range[64]={0};
        sprintf(range, "Range: bytes=%ld-%ld", start_pos, end_pos);
        header = curl_slist_append(header, range);
        curl_easy_setopt(curl, CURLOPT_HTTPHEADER, header);
    }

    error = curl_do(curl);
    if(return_size != NULL){
        *return_size = body.pos_n;
    }
    if((end_pos - start_pos) > 0){
        curl_slist_free_all(header);
    }
    curl_easy_cleanup(curl);
    return error;
}